

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::Lookup::selectChild
               (Type *virtualInterface,SourceRange range,
               span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
               selectors,ASTContext *context,LookupResult *result)

{
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *__v
  ;
  pointer pNVar1;
  SourceLocation *pSVar2;
  Compilation *dst;
  SourceLocation SVar3;
  undefined8 uVar4;
  size_t sVar5;
  char *pcVar6;
  SourceLocation SVar7;
  NameComponents name;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  SourceLocation p;
  __extent_storage<18446744073709551615UL> _Var8;
  int iVar9;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *pvVar10;
  EVP_PKEY_CTX *pEVar11;
  undefined4 extraout_var;
  SourceLocation SVar12;
  long lVar13;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  Symbol *pSVar14;
  EVP_PKEY_CTX *pEVar15;
  long lVar16;
  EVP_PKEY_CTX *src;
  SourceLocation extraout_RDX;
  SourceLocation extraout_RDX_00;
  SourceLocation extraout_RDX_01;
  SourceLocation extraout_RDX_02;
  SourceLocation extraout_RDX_03;
  SourceLocation SVar17;
  SourceLocation SVar18;
  undefined8 *puVar19;
  SourceLocation SVar20;
  undefined8 *puVar21;
  __extent_storage<18446744073709551615UL> _Var22;
  ulong uVar23;
  bool bVar24;
  byte bVar25;
  SourceRange range_00;
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> elementSelects;
  NameComponents unused;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> local_1e8 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ParameterValueAssignmentSyntax *local_178;
  SourceLocation local_168;
  __extent_storage<18446744073709551615UL> local_160;
  ulong local_158;
  undefined1 local_150 [288];
  
  _Var22 = selectors._M_extent._M_extent_value;
  bVar25 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_178 = (ParameterValueAssignmentSyntax *)0x0;
  local_168 = (SourceLocation)local_150;
  local_160._M_extent_value = 0;
  local_158 = 4;
  local_1e8[0].data_ = (pointer)local_1e8[0].firstElement;
  local_1e8[0].len = 0;
  local_1e8[0].cap = 5;
  if ((pointer)_Var22._M_extent_value != (pointer)0x0) {
    dst = ((context->scope).ptr)->compilation;
    pvVar10 = selectors._M_ptr + _Var22._M_extent_value;
    SVar17 = range.endLoc;
    do {
      __v = pvVar10 + -1;
      if (pvVar10[-1].
          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          ._M_index == '\x01') {
        SVar3 = *(SourceLocation *)
                 ((long)&pvVar10[-1].
                         super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         ._M_u + 0x10);
        sVar5 = *(size_t *)
                 &(__v->
                  super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  ).
                  super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  ._M_u;
        pcVar6 = *(char **)((long)&pvVar10[-1].
                                   super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   ._M_u + 8);
        SVar7 = *(SourceLocation *)
                 ((long)&pvVar10[-1].
                         super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         .
                         super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                         ._M_u + 0x18);
        SVar18 = *(SourceLocation *)
                  ((long)&pvVar10[-1].
                          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          ._M_u + 0x20);
        src = (EVP_PKEY_CTX *)CONCAT71(SVar17._1_7_,local_1e8[0].len != 0);
        pEVar15 = (EVP_PKEY_CTX *)((long)local_1e8[0].data_ + local_1e8[0].len * 8 + -8);
        if (local_1e8[0].data_ < pEVar15 && local_1e8[0].len != 0) {
          pEVar11 = (EVP_PKEY_CTX *)((long)local_1e8[0].data_ + 8);
          do {
            uVar4 = *(undefined8 *)(pEVar11 + -8);
            *(undefined8 *)(pEVar11 + -8) = *(undefined8 *)pEVar15;
            *(undefined8 *)pEVar15 = uVar4;
            pEVar15 = pEVar15 + -8;
            src = pEVar11 + 8;
            bVar24 = pEVar11 < pEVar15;
            pEVar11 = src;
          } while (bVar24);
        }
        iVar9 = SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::copy
                          (local_1e8,(EVP_PKEY_CTX *)dst,src);
        _Var8._M_extent_value = local_160._M_extent_value;
        SVar17 = (SourceLocation)(local_160._M_extent_value * 0x48 + (long)local_168);
        if (local_160._M_extent_value == local_158) {
          if (local_160._M_extent_value == 0x1c71c71c71c71c7) {
            slang::detail::throwLengthError();
          }
          uVar23 = local_160._M_extent_value + 1;
          if (local_160._M_extent_value + 1 < local_158 * 2) {
            uVar23 = local_158 * 2;
          }
          if (0x1c71c71c71c71c7 - local_158 < local_158) {
            uVar23 = 0x1c71c71c71c71c7;
          }
          SVar12 = (SourceLocation)operator_new(uVar23 * 0x48);
          p = local_168;
          pSVar2 = (SourceLocation *)((long)((long)SVar12 + 0x10) + _Var8._M_extent_value * 0x48);
          *pSVar2 = SVar7;
          pSVar2[1] = SVar18;
          pNVar1 = (pointer)((long)SVar12 + _Var8._M_extent_value * 0x48);
          (pNVar1->name).text._M_len = sVar5;
          (pNVar1->name).text._M_str = pcVar6;
          *(pointer *)((long)((long)SVar12 + 0x20) + _Var8._M_extent_value * 0x48) =
               (pointer)CONCAT44(extraout_var,iVar9);
          ((__extent_storage<18446744073709551615UL> *)((long)SVar12 + 0x28))
          [_Var8._M_extent_value * 9]._M_extent_value = (size_t)extraout_RDX;
          ((ParameterValueAssignmentSyntax **)((long)SVar12 + 0x30))[_Var8._M_extent_value * 9] =
               (ParameterValueAssignmentSyntax *)0x0;
          ((SourceLocation *)((long)SVar12 + 0x38))[_Var8._M_extent_value * 9] = SVar3;
          lVar13 = (long)(local_160._M_extent_value * 0x48 + (long)local_168) - (long)SVar17;
          SVar3 = SVar12;
          SVar7 = local_168;
          if (lVar13 == 0) {
            SVar17 = extraout_RDX_00;
            if (local_160._M_extent_value != 0) {
              SVar17 = (SourceLocation)0x0;
              do {
                puVar19 = (undefined8 *)((long)SVar17 + (long)local_168);
                puVar21 = (undefined8 *)((long)SVar12 + (long)SVar17);
                for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                  *puVar21 = *puVar19;
                  puVar19 = puVar19 + (ulong)bVar25 * -2 + 1;
                  puVar21 = puVar21 + (ulong)bVar25 * -2 + 1;
                }
                SVar17 = (SourceLocation)((long)SVar17 + 0x48);
              } while ((SourceLocation)(local_160._M_extent_value * 0x48) != SVar17);
            }
          }
          else {
            while (SVar7 != SVar17) {
              SVar18 = SVar7;
              SVar20 = SVar3;
              for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
                *(undefined8 *)SVar20 = *(undefined8 *)SVar18;
                SVar18 = (SourceLocation)((char **)((long)SVar18 + 8) + (ulong)bVar25 * -2);
                SVar20 = (SourceLocation)((char **)((long)SVar20 + 8) + (ulong)bVar25 * -2);
              }
              _Var22._M_extent_value = (long)SVar7 + 0x48;
              SVar3 = (SourceLocation)((long)SVar3 + 0x48);
              SVar7 = (SourceLocation)_Var22._M_extent_value;
            }
            memcpy((pointer)((long)SVar12 + _Var8._M_extent_value * 0x48) + 1,(void *)SVar17,
                   ((lVar13 - 0x48U) / 0x48) * 0x48 + 0x48);
            SVar17 = extraout_RDX_01;
          }
          if (p != (SourceLocation)local_150) {
            operator_delete((void *)p);
            SVar17 = extraout_RDX_03;
          }
        }
        else {
          ((SourceRange *)((long)SVar17 + 0x10))->startLoc = SVar7;
          *(SourceLocation *)((long)SVar17 + 0x18) = SVar18;
          *(size_t *)SVar17 = sVar5;
          *(char **)((long)SVar17 + 8) = pcVar6;
          ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
          ((long)SVar17 + 0x20))->_M_ptr = (pointer)CONCAT44(extraout_var,iVar9);
          ((__extent_storage<18446744073709551615UL> *)((long)SVar17 + 0x28))->_M_extent_value =
               (size_t)extraout_RDX;
          *(ParameterValueAssignmentSyntax **)((long)SVar17 + 0x30) =
               (ParameterValueAssignmentSyntax *)0x0;
          *(SourceLocation *)((long)SVar17 + 0x38) = SVar3;
          SVar17 = extraout_RDX;
          SVar12 = local_168;
          uVar23 = local_158;
        }
        local_158 = uVar23;
        local_168 = SVar12;
        local_160._M_extent_value = local_160._M_extent_value + 1;
        local_1e8[0].len = 0;
      }
      else {
        args = std::
               get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         (__v);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
        emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)local_1e8,args);
        SVar17 = extraout_RDX_02;
      }
      pvVar10 = __v;
    } while (__v != selectors._M_ptr);
  }
  range_00.endLoc = (SourceLocation)_Var22._M_extent_value;
  range_00.startLoc = range.endLoc;
  pSVar14 = anon_unknown_39::getVirtualInterfaceTarget
                      ((anon_unknown_39 *)virtualInterface,(Type *)context,
                       (ASTContext *)range.startLoc,range_00);
  result->found = pSVar14;
  nameParts_00._M_extent._M_extent_value = local_160._M_extent_value;
  nameParts_00._M_ptr = (pointer)local_168;
  name.text._M_str = (char *)uStack_1a0;
  name.text._M_len = local_1a8;
  name.range.startLoc = (SourceLocation)local_198;
  name.range.endLoc = (SourceLocation)uStack_190;
  name.selectors._M_ptr = (pointer)local_188;
  name.selectors._M_extent._M_extent_value = uStack_180;
  name.paramAssignments = local_178;
  anon_unknown_39::lookupDownward
            (nameParts_00,name,context,(bitmask<slang::ast::LookupFlags>)0x0,result);
  if (local_1e8[0].data_ != (pointer)local_1e8[0].firstElement) {
    operator_delete(local_1e8[0].data_);
  }
  if (local_168 != (SourceLocation)local_150) {
    operator_delete((void *)local_168);
  }
  return;
}

Assistant:

void Lookup::selectChild(const Type& virtualInterface, SourceRange range,
                         std::span<LookupResult::Selector> selectors, const ASTContext& context,
                         LookupResult& result) {
    NameComponents unused;
    SmallVector<NamePlusLoc, 4> nameParts;
    SmallVector<const ElementSelectSyntax*> elementSelects;
    auto& comp = context.getCompilation();

    for (auto& selector : std::views::reverse(selectors)) {
        if (auto memberSel = std::get_if<LookupResult::MemberSelector>(&selector)) {
            NamePlusLoc npl;
            npl.dotLocation = memberSel->dotLocation;
            npl.name.text = memberSel->name;
            npl.name.range = memberSel->nameRange;
            std::ranges::reverse(elementSelects); // reverse the element selects since we initially
                                                  // saw them in reverse order
            npl.name.selectors = elementSelects.copy(comp);

            nameParts.push_back(npl);
            elementSelects.clear();
        }
        else {
            elementSelects.push_back(std::get<const ElementSelectSyntax*>(selector));
        }
    }

    result.found = getVirtualInterfaceTarget(virtualInterface, context, range);
    lookupDownward(nameParts, unused, context, LookupFlags::None, result);
}